

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

QRegularExpressionMatch __thiscall
QRegularExpression::match
          (QRegularExpression *this,QString *subject,qsizetype offset,MatchType matchType,
          MatchOptions matchOptions)

{
  storage_type_conflict *psVar1;
  qsizetype qVar2;
  Data *pDVar3;
  QRegularExpressionMatchPrivate *priv;
  undefined4 in_register_0000000c;
  Int in_R9D;
  
  QRegularExpressionPrivate::compilePattern((QRegularExpressionPrivate *)(subject->d).d);
  priv = (QRegularExpressionMatchPrivate *)operator_new(0x60);
  psVar1 = *(storage_type_conflict **)(offset + 8);
  qVar2 = *(qsizetype *)(offset + 0x10);
  (priv->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  QRegularExpression(&priv->regularExpression,(QRegularExpression *)subject);
  pDVar3 = *(Data **)offset;
  (priv->subjectStorage).d.d = pDVar3;
  (priv->subjectStorage).d.ptr = *(char16_t **)(offset + 8);
  (priv->subjectStorage).d.size = *(qsizetype *)(offset + 0x10);
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (priv->subject).m_size = qVar2;
  (priv->subject).m_data = psVar1;
  priv->matchType =
       (MatchType)
       matchOptions.super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
       super_QFlagsStorage<QRegularExpression::MatchOption>.i;
  (priv->matchOptions).super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
  super_QFlagsStorage<QRegularExpression::MatchOption>.i = in_R9D;
  (priv->capturedOffsets).d.d = (Data *)0x0;
  (priv->capturedOffsets).d.ptr = (longlong *)0x0;
  *(undefined8 *)((long)&(priv->capturedOffsets).d.ptr + 7) = 0;
  *(undefined8 *)((long)&(priv->capturedOffsets).d.size + 7) = 0;
  QRegularExpressionPrivate::doMatch
            ((QRegularExpressionPrivate *)(subject->d).d,priv,
             CONCAT44(in_register_0000000c,matchType),CheckSubjectString,
             (QRegularExpressionMatchPrivate *)0x0);
  QRegularExpressionMatch::QRegularExpressionMatch((QRegularExpressionMatch *)this,priv);
  return (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
         (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)this;
}

Assistant:

QRegularExpressionMatch QRegularExpression::match(const QString &subject,
                                                  qsizetype offset,
                                                  MatchType matchType,
                                                  MatchOptions matchOptions) const
{
    d.data()->compilePattern();
    auto priv = new QRegularExpressionMatchPrivate(*this,
                                                   subject,
                                                   QStringView(subject),
                                                   matchType,
                                                   matchOptions);
    d->doMatch(priv, offset);
    return QRegularExpressionMatch(*priv);
}